

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Room.cpp
# Opt level: O3

void __thiscall Room::shuffleTiles(Room *this)

{
  uint uVar1;
  uint uVar2;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_10;
  
  uVar1 = std::chrono::_V2::system_clock::now();
  uVar2 = uVar1 / 0x7fffffff << 0x1f | uVar1 / 0x7fffffff;
  local_10._M_x = (unsigned_long)(uVar2 + uVar1 + (uint)(uVar1 + uVar2 == 0));
  std::shuffle<Tile*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
            ((this->tiles)._M_elems,(Tile *)(this + 1),&local_10);
  return;
}

Assistant:

void Room::shuffleTiles() {
    unsigned seed = std::chrono::system_clock::now().time_since_epoch().count();
    shuffle(tiles.begin(), tiles.end(), std::default_random_engine(seed));
}